

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

void __thiscall
chrono::ChFrameMoving<double>::ArchiveOUT(ChFrameMoving<double> *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChCoordsys<double>_> local_48;
  ChNameValue<chrono::ChCoordsys<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFrameMoving<double>>(marchive);
  ChFrame<double>::ArchiveOUT(&this->super_ChFrame<double>,marchive);
  local_30._value = &this->coord_dt;
  local_30._name = "coord_dt";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->coord_dtdt;
  local_48._name = "coord_dtdt";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive) override {
        // version number
        marchive.VersionWrite<ChFrameMoving>();

        // serialize parent class
        ChFrame<Real>::ArchiveOUT(marchive);

        // serialize all member data
        marchive << CHNVP(coord_dt);
        marchive << CHNVP(coord_dtdt);
    }